

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgm_controller.cpp
# Opt level: O1

void __thiscall r_exec::PGMController::reduce(PGMController *this,View *input)

{
  mutex *__mutex;
  list<core::P<r_exec::Overlay>_> *plVar1;
  uint64_t uVar2;
  pointer pcVar3;
  long lVar4;
  __atomic_base<long> _Var5;
  int64_t iVar6;
  int __e;
  int iVar7;
  long lVar8;
  _Object *p_Var9;
  undefined4 extraout_var_00;
  int64_t iVar10;
  bool bVar11;
  P<r_exec::Overlay> local_40;
  pthread_mutex_t *local_38;
  undefined4 extraout_var;
  
  uVar2 = (this->super__PGMController).super_OController.super_Controller.tsc;
  __mutex = &(this->super__PGMController).super_OController.super_Controller.m_reductionMutex;
  iVar7 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  local_38 = (pthread_mutex_t *)__mutex;
  if (uVar2 == 0) {
    if (iVar7 != 0) goto LAB_001962ff;
    iVar10 = (this->super__PGMController).super_OController.overlays.used_cells_head;
    if (iVar10 != -1) {
      plVar1 = &(this->super__PGMController).super_OController.overlays;
      do {
        iVar7 = (*((plVar1->cells).
                   super__Vector_base<r_code::list<core::P<r_exec::Overlay>_>::cell,_std::allocator<r_code::list<core::P<r_exec::Overlay>_>::cell>_>
                   ._M_impl.super__Vector_impl_data._M_start[iVar10].data.object)->_vptr__Object[4])
                          ();
        pcVar3 = (plVar1->cells).
                 super__Vector_base<r_code::list<core::P<r_exec::Overlay>_>::cell,_std::allocator<r_code::list<core::P<r_exec::Overlay>_>::cell>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((char)iVar7 == '\0') {
          p_Var9 = pcVar3[iVar10].data.object;
          iVar7 = (*p_Var9->_vptr__Object[3])(p_Var9,input);
          p_Var9 = (_Object *)CONCAT44(extraout_var_00,iVar7);
          if (p_Var9 != (_Object *)0x0) {
            LOCK();
            (p_Var9->refCount).super___atomic_base<long>._M_i =
                 (p_Var9->refCount).super___atomic_base<long>._M_i + 1;
            UNLOCK();
            local_40.object = p_Var9;
            r_code::list<core::P<r_exec::Overlay>_>::push_front(plVar1,&local_40);
            if (local_40.object != (_Object *)0x0) {
              LOCK();
              ((local_40.object)->refCount).super___atomic_base<long>._M_i =
                   ((local_40.object)->refCount).super___atomic_base<long>._M_i + -1;
              UNLOCK();
              if (((local_40.object)->refCount).super___atomic_base<long>._M_i < 1) {
                (*(local_40.object)->_vptr__Object[1])();
              }
            }
          }
          if (((this->super__PGMController).super_OController.super_Controller.invalidated == 0) &&
             ((this->super__PGMController).super_OController.super_Controller.activated == 1)) {
            iVar10 = (plVar1->cells).
                     super__Vector_base<r_code::list<core::P<r_exec::Overlay>_>::cell,_std::allocator<r_code::list<core::P<r_exec::Overlay>_>::cell>_>
                     ._M_impl.super__Vector_impl_data._M_start[iVar10].next;
            bVar11 = true;
          }
          else {
            bVar11 = false;
          }
          if (!bVar11) break;
        }
        else {
          iVar6 = pcVar3[iVar10].next;
          r_code::list<core::P<r_exec::Overlay>_>::__erase(plVar1,iVar10);
          iVar10 = iVar6;
        }
      } while (iVar10 != -1);
    }
  }
  else {
    if (iVar7 != 0) {
LAB_001962ff:
      std::__throw_system_error(iVar7);
    }
    lVar8 = (*Now)();
    iVar10 = (this->super__PGMController).super_OController.overlays.used_cells_head;
    if (iVar10 != -1) {
      plVar1 = &(this->super__PGMController).super_OController.overlays;
      do {
        iVar7 = (*((plVar1->cells).
                   super__Vector_base<r_code::list<core::P<r_exec::Overlay>_>::cell,_std::allocator<r_code::list<core::P<r_exec::Overlay>_>::cell>_>
                   ._M_impl.super__Vector_impl_data._M_start[iVar10].data.object)->_vptr__Object[4])
                          ();
        pcVar3 = (plVar1->cells).
                 super__Vector_base<r_code::list<core::P<r_exec::Overlay>_>::cell,_std::allocator<r_code::list<core::P<r_exec::Overlay>_>::cell>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((char)iVar7 == '\0') {
          p_Var9 = pcVar3[iVar10].data.object;
          _Var5._M_i = p_Var9[8].refCount.super___atomic_base<long>._M_i;
          if ((_Var5._M_i == 0) ||
             ((ulong)(lVar8 - _Var5._M_i) <=
              (this->super__PGMController).super_OController.super_Controller.tsc)) {
            iVar7 = (*p_Var9->_vptr__Object[3])(p_Var9,input);
            p_Var9 = (_Object *)CONCAT44(extraout_var,iVar7);
            if (p_Var9 != (_Object *)0x0) {
              LOCK();
              (p_Var9->refCount).super___atomic_base<long>._M_i =
                   (p_Var9->refCount).super___atomic_base<long>._M_i + 1;
              UNLOCK();
              local_40.object = p_Var9;
              r_code::list<core::P<r_exec::Overlay>_>::push_front(plVar1,&local_40);
              if (local_40.object != (_Object *)0x0) {
                LOCK();
                ((local_40.object)->refCount).super___atomic_base<long>._M_i =
                     ((local_40.object)->refCount).super___atomic_base<long>._M_i + -1;
                UNLOCK();
                if (((local_40.object)->refCount).super___atomic_base<long>._M_i < 1) {
                  (*(local_40.object)->_vptr__Object[1])();
                }
              }
            }
            if ((this->super__PGMController).super_OController.super_Controller.invalidated == 0) {
              bVar11 = (this->super__PGMController).super_OController.super_Controller.activated ==
                       1;
            }
            else {
              bVar11 = false;
            }
            if (bVar11) {
              iVar10 = (plVar1->cells).
                       super__Vector_base<r_code::list<core::P<r_exec::Overlay>_>::cell,_std::allocator<r_code::list<core::P<r_exec::Overlay>_>::cell>_>
                       ._M_impl.super__Vector_impl_data._M_start[iVar10].next;
            }
          }
          else {
            iVar6 = (plVar1->cells).
                    super__Vector_base<r_code::list<core::P<r_exec::Overlay>_>::cell,_std::allocator<r_code::list<core::P<r_exec::Overlay>_>::cell>_>
                    ._M_impl.super__Vector_impl_data._M_start[iVar10].next;
            r_code::list<core::P<r_exec::Overlay>_>::__erase(plVar1,iVar10);
            bVar11 = true;
            iVar10 = iVar6;
          }
          if (!bVar11) break;
        }
        else {
          lVar4 = pcVar3[iVar10].next;
          r_code::list<core::P<r_exec::Overlay>_>::__erase(plVar1,iVar10);
          iVar10 = lVar4;
        }
      } while (iVar10 != -1);
    }
  }
  pthread_mutex_unlock(local_38);
  return;
}

Assistant:

void PGMController::reduce(r_exec::View *input)
{
    r_code::list<P<Overlay> >::const_iterator o;

    //uint64_t oid=input->object->get_oid();
    //uint64_t t=Now()-Utils::GetTimeReference();
    //std::cout<<Time::ToString_seconds(t)<<" got "<<oid<<" "<<input->get_sync()<<std::endl;
    if (tsc > 0) {
        std::lock_guard<std::mutex> guard(m_reductionMutex);
        uint64_t now = Now(); // call must be located after the CS.enter() since (*o)->reduce() may update (*o)->birth_time.

        //uint64_t t=now-Utils::GetTimeReference();
        for (o = overlays.begin(); o != overlays.end();) {
            if ((*o)->is_invalidated()) {
                o = overlays.erase(o);
            } else {
                uint64_t birth_time = ((PGMOverlay *)*o)->get_birth_time();

                if (birth_time > 0 && now - birth_time > tsc) {
                    //std::cout<<Time::ToString_seconds(t)<<" kill "<<std::hex<<(void *)*o<<std::dec<<" born: "<<Time::ToString_seconds(birth_time-Utils::GetTimeReference())<<" after "<<Time::ToString_seconds(now-birth_time)<<std::endl;
                    //std::cout<<std::hex<<(void *)*o<<std::dec<<" ------------kill "<<input->object->get_oid()<<" ignored "<<std::endl;
                    o = overlays.erase(o);
                } else {
                    //void *oo=*o;
                    Overlay *offspring = (*o)->reduce_view(input);

                    if (offspring) {
                        overlays.push_front(offspring);
                        //std::cout<<Time::ToString_seconds(t)<<" "<<std::hex<<oo<<std::dec<<" born: "<<Time::ToString_seconds(((PGMOverlay *)oo)->get_birth_time()-Utils::GetTimeReference())<<" reduced "<<input->object->get_oid()<<" "<<input->get_sync()<<" offspring: "<<std::hex<<offspring<<std::dec<<std::endl;
                        //std::cout<<std::hex<<(void *)oo<<std::dec<<" --------------- reduced "<<input->object->get_oid()<<" "<<input->get_sync()<<std::endl;
                    }

                    if (!is_alive()) {
                        break;
                    }

                    ++o;
                }
            }
        }
    } else {
        std::lock_guard<std::mutex> guard(m_reductionMutex);

        for (o = overlays.begin(); o != overlays.end();) {
            if ((*o)->is_invalidated()) {
                o = overlays.erase(o);
            } else {
                Overlay *offspring = (*o)->reduce_view(input);

                if (offspring) {
                    overlays.push_front(offspring);
                }

                if (!is_alive()) {
                    break;
                }

                ++o;
            }
        }
    }
}